

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterWriteDTD
              (xmlTextWriterPtr writer,xmlChar *name,xmlChar *pubid,xmlChar *sysid,xmlChar *subset)

{
  int iVar1;
  int local_40;
  int sum;
  int count;
  xmlChar *subset_local;
  xmlChar *sysid_local;
  xmlChar *pubid_local;
  xmlChar *name_local;
  xmlTextWriterPtr writer_local;
  
  local_40 = xmlTextWriterStartDTD(writer,name,pubid,sysid);
  if (local_40 == -1) {
    writer_local._4_4_ = -1;
  }
  else {
    if (subset != (xmlChar *)0x0) {
      iVar1 = xmlTextWriterWriteString(writer,subset);
      if (iVar1 == -1) {
        return -1;
      }
      local_40 = iVar1 + local_40;
    }
    iVar1 = xmlTextWriterEndDTD(writer);
    if (iVar1 == -1) {
      writer_local._4_4_ = -1;
    }
    else {
      writer_local._4_4_ = iVar1 + local_40;
    }
  }
  return writer_local._4_4_;
}

Assistant:

int
xmlTextWriterWriteDTD(xmlTextWriterPtr writer,
                      const xmlChar * name,
                      const xmlChar * pubid,
                      const xmlChar * sysid, const xmlChar * subset)
{
    int count;
    int sum;

    sum = 0;
    count = xmlTextWriterStartDTD(writer, name, pubid, sysid);
    if (count == -1)
        return -1;
    sum += count;
    if (subset != 0) {
        count = xmlTextWriterWriteString(writer, subset);
        if (count == -1)
            return -1;
        sum += count;
    }
    count = xmlTextWriterEndDTD(writer);
    if (count == -1)
        return -1;
    sum += count;

    return sum;
}